

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  int iVar2;
  undefined1 auVar3 [16];
  code *pcVar4;
  uint newSize;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  SimpleDictionaryEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
  *dst;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint bucketCount;
  size_t requestedBytes;
  int *local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) &&
     (uVar11 = uVar1 & 0x7fffffff, bucketCount = uVar11, (uVar1 - 1 & uVar11) != 0)) {
    iVar2 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    bucketCount = 2;
    if (uVar11 != 1) {
      bucketCount = 1 << (-((byte)iVar2 ^ 0x1f) & 0x1f);
    }
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    if (newSize == 0) {
      dst = (SimpleDictionaryEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
             *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(int)newSize;
      requestedBytes = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
        requestedBytes = SUB168(auVar3 * ZEXT816(0x18),0);
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_007aad12;
        *puVar8 = 0;
      }
      if (requestedBytes == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                           "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar5) goto LAB_007aad12;
        *puVar8 = 0;
      }
      dst = (SimpleDictionaryEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
             *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset((char *)((long)&(dst->
                             super_DefaultHashedEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             ).
                             super_KeyValueEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
                             .
                             super_ValueEntry<SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                             .
                             super_KeyValueEntryDataLayout2<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
                             .value + requestedBytes),0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (SimpleDictionaryEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
                  *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_007aad12:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
    }
    newBuckets = (int *)dst;
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,SList<Js::AsmJsScriptFunction*,Memory::ArenaAllocator,RealCount>*>,SList<Js::AsmJsScriptFunction*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = (Type)newBuckets;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,SList<Js::AsmJsScriptFunction*,Memory::ArenaAllocator,RealCount>*>,SList<Js::AsmJsScriptFunction*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator>
              ((SimpleDictionaryEntry<void_*,_SList<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>_*>
                *)newBuckets,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar9 = 8;
      lVar10 = 0;
      do {
        if (-2 < *(int *)((long)newBuckets + lVar9)) {
          uVar7 = GetBucket((uint)(*(ulong *)((long)newBuckets + lVar9 + 8) >> 3) | 1,bucketCount,
                            this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar9) = local_40[(int)uVar7];
          local_40[(int)uVar7] = (int)lVar10;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x18;
      } while (lVar10 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_40;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }